

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O0

void __thiscall ZXing::BitMatrix::rotate90(BitMatrix *this)

{
  bool bVar1;
  int iVar2;
  BitMatrix *in_RDI;
  int y;
  int x;
  BitMatrix result;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_40;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  int iVar4;
  
  height(in_RDI);
  width(in_RDI);
  BitMatrix((BitMatrix *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  iVar3 = 0;
  while (iVar4 = iVar3, iVar2 = width(in_RDI), iVar3 < iVar2) {
    for (local_40 = 0; iVar3 = height(in_RDI), local_40 < iVar3; local_40 = local_40 + 1) {
      bVar1 = get((BitMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      if (bVar1) {
        in_stack_ffffffffffffff94 = local_40;
        width(in_RDI);
        set((BitMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,false);
      }
    }
    iVar3 = iVar4 + 1;
  }
  operator=((BitMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            (BitMatrix *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ~BitMatrix((BitMatrix *)0x21adaa);
  return;
}

Assistant:

void
BitMatrix::rotate90()
{
	BitMatrix result(height(), width());
	for (int x = 0; x < width(); ++x) {
		for (int y = 0; y < height(); ++y) {
			if (get(x, y)) {
				result.set(y, width() - x - 1);
			}
		}
	}
	*this = std::move(result);
}